

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandFastExtract(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Fxu_Data_t Params;
  uint local_9c;
  Fxu_Data_t local_98;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  Abc_NtkSetDefaultFxParams(&local_98);
  Extra_UtilGetoptReset();
  local_9c = 1000000000;
  bVar1 = true;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"SDNWMPsdzcnxvwh"), pNtk = local_38,
          iVar4 = globalUtilOptind, 0x62 < iVar2) {
      switch(iVar2) {
      case 0x6e:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
      case 0x79:
        goto switchD_0024f3e7_caseD_4f;
      case 0x73:
        local_98.fOnlyS = local_98.fOnlyS ^ 1;
        break;
      case 0x76:
        local_98.fVerbose = local_98.fVerbose ^ 1;
        break;
      case 0x77:
        local_98.fVeryVerbose = local_98.fVeryVerbose ^ 1;
        break;
      case 0x78:
        local_98.fCanonDivs = local_98.fCanonDivs ^ 1;
        break;
      case 0x7a:
        local_98.fUse0 = local_98.fUse0 ^ 1;
        break;
      default:
        if (iVar2 == 99) {
          local_98.fUseCompl = local_98.fUseCompl ^ 1;
        }
        else {
          if (iVar2 != 100) goto switchD_0024f3e7_caseD_4f;
          local_98.fOnlyD = local_98.fOnlyD ^ 1;
        }
      }
    }
    switch(iVar2) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-M\" should be followed by an integer.\n";
LAB_0024f5c6:
        Abc_Print(-1,pcVar5);
        goto switchD_0024f3e7_caseD_4f;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.LitCountMax = uVar3;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0024f5c6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.nNodesExt = uVar3;
      break;
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
    case 0x56:
      goto switchD_0024f3e7_caseD_4f;
    case 0x50:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_0024f5c6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_9c = uVar3;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0024f5c6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.nSingleMax = uVar3;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0024f5c6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.WeightMin = uVar3;
      break;
    default:
      if (iVar2 != 0x44) {
        if (iVar2 == -1) {
          if (local_38 == (Abc_Ntk_t *)0x0) {
            pcVar5 = "Empty network.\n";
          }
          else {
            if ((local_38->nObjCounts[7] == 0) || (local_38->vPis->nSize == 0)) {
              Abc_Print(0,"The network does not have internal nodes.\n");
              return 0;
            }
            if (local_38->ntkType == ABC_NTK_LOGIC) {
              if (local_38->ntkFunc == ABC_FUNC_SOP) {
                iVar4 = Abc_NtkGetCubePairNum(local_38);
                if ((int)local_9c < iVar4) {
                  Abc_Print(-1,
                            "Cannot perform \"fx\" because the number cube pairs exceeds the limit (%d).\n"
                           );
                  return 1;
                }
                if (bVar1) {
                  Abc_NtkFxPerform(pNtk,local_98.nNodesExt,local_98.LitCountMax,local_98.fCanonDivs,
                                   local_98.fVerbose,local_98.fVeryVerbose);
                }
                else {
                  Abc_NtkFastExtract(pNtk,&local_98);
                }
                Abc_NtkFxuFreeInfo(&local_98);
                return 0;
              }
              pcVar5 = 
              "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n"
              ;
            }
            else {
              pcVar5 = 
              "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n";
            }
          }
          iVar4 = -1;
          goto LAB_0024f794;
        }
        goto switchD_0024f3e7_caseD_4f;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_0024f5c6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.nPairsMax = uVar3;
    }
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)uVar3);
switchD_0024f3e7_caseD_4f:
  Abc_Print(-2,"usage: fx [-SDNWMP <num>] [-sdzcnxvwh]\n");
  Abc_Print(-2,"\t           performs unate fast extract on the current network\n");
  Abc_Print(-2,"\t-S <num> : max number of single-cube divisors to consider [default = %d]\n",
            (ulong)(uint)local_98.nSingleMax);
  Abc_Print(-2,"\t-D <num> : max number of double-cube divisors to consider [default = %d]\n",
            (ulong)(uint)local_98.nPairsMax);
  Abc_Print(-2,"\t-N <num> : max number of divisors to extract during this run [default = %d]\n",
            (ulong)(uint)local_98.nNodesExt);
  Abc_Print(-2,"\t-W <num> : lower bound on the weight of divisors to extract [default = %d]\n",
            (ulong)(uint)local_98.WeightMin);
  Abc_Print(-2,"\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n",
            (ulong)(uint)local_98.LitCountMax);
  Abc_Print(-2,"\t-P <num> : skip \"fx\" if cube pair count exceeds this limit [default = %d]\n",
            (ulong)local_9c);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (local_98.fOnlyS == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s       : use only single-cube divisors [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_98.fOnlyD == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-d       : use only double-cube divisors [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_98.fUse0 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-z       : use zero-weight divisors [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_98.fUseCompl == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-c       : use complement in the binary case [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-n       : use new implementation of fast extract [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_98.fCanonDivs == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-x       : use only canonical divisors (AND, XOR, MUX) [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_98.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar5);
  if (local_98.fVeryVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-w       : print additional information [default = %s]\n",pcVar6);
  pcVar5 = "\t-h       : print the command usage\n";
  iVar4 = -2;
LAB_0024f794:
  Abc_Print(iVar4,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandFastExtract( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkFxPerform( Abc_Ntk_t * pNtk, int nNewNodesMax, int nLitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Fxu_Data_t Params, * p = &Params;
    int c, fNewAlgo = 1;
    int nPairsLimit = 1000000000;
    // set the defaults
    Abc_NtkSetDefaultFxParams( p );
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "SDNWMPsdzcnxvwh")) != EOF )
    {
        switch (c)
        {
            case 'S':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nSingleMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nSingleMax < 0 )
                    goto usage;
                break;
            case 'D':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nPairsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nPairsMax < 0 )
                    goto usage;
                break;
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nNodesExt = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nNodesExt < 0 )
                    goto usage;
                break;
            case 'W':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->WeightMin = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->WeightMin < 0 )
                    goto usage;
                break;
            case 'M':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->LitCountMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->LitCountMax < 0 )
                    goto usage;
                break;
            case 'P':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                    goto usage;
                }
                nPairsLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nPairsLimit < 0 )
                    goto usage;
                break;
            case 's':
                p->fOnlyS ^= 1;
                break;
            case 'd':
                p->fOnlyD ^= 1;
                break;
            case 'z':
                p->fUse0 ^= 1;
                break;
            case 'c':
                p->fUseCompl ^= 1;
                break;
            case 'n':
                fNewAlgo ^= 1;
                break;
            case 'x':
                p->fCanonDivs ^= 1;
                break;
            case 'v':
                p->fVerbose ^= 1;
                break;
            case 'w':
                p->fVeryVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkNodeNum(pNtk) == 0 || Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The network does not have internal nodes.\n" );
        return 0;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n" );
        return 1;
    }
    if ( Abc_NtkGetCubePairNum(pNtk) > nPairsLimit )
    {
        Abc_Print( -1, "Cannot perform \"fx\" because the number cube pairs exceeds the limit (%d).\n", nPairsLimit );
        return 1;
    }

    // the nodes to be merged are linked into the special linked list
    if ( fNewAlgo )
        Abc_NtkFxPerform( pNtk, p->nNodesExt, p->LitCountMax, p->fCanonDivs, p->fVerbose, p->fVeryVerbose );
    else
        Abc_NtkFastExtract( pNtk, p );
    Abc_NtkFxuFreeInfo( p );
    return 0;

usage:
    Abc_Print( -2, "usage: fx [-SDNWMP <num>] [-sdzcnxvwh]\n");
    Abc_Print( -2, "\t           performs unate fast extract on the current network\n");
    Abc_Print( -2, "\t-S <num> : max number of single-cube divisors to consider [default = %d]\n", p->nSingleMax );
    Abc_Print( -2, "\t-D <num> : max number of double-cube divisors to consider [default = %d]\n", p->nPairsMax );
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = %d]\n", p->nNodesExt );
    Abc_Print( -2, "\t-W <num> : lower bound on the weight of divisors to extract [default = %d]\n", p->WeightMin );
    Abc_Print( -2, "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n", p->LitCountMax );
    Abc_Print( -2, "\t-P <num> : skip \"fx\" if cube pair count exceeds this limit [default = %d]\n", nPairsLimit );
    Abc_Print( -2, "\t-s       : use only single-cube divisors [default = %s]\n", p->fOnlyS? "yes": "no" );
    Abc_Print( -2, "\t-d       : use only double-cube divisors [default = %s]\n", p->fOnlyD? "yes": "no" );
    Abc_Print( -2, "\t-z       : use zero-weight divisors [default = %s]\n", p->fUse0? "yes": "no" );
    Abc_Print( -2, "\t-c       : use complement in the binary case [default = %s]\n", p->fUseCompl? "yes": "no" );
    Abc_Print( -2, "\t-n       : use new implementation of fast extract [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-x       : use only canonical divisors (AND, XOR, MUX) [default = %s]\n", p->fCanonDivs? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", p->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : print additional information [default = %s]\n", p->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}